

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

string * cmCTest::MakeURLSafe(string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  ulong uStack_1a8;
  uchar ch;
  size_type pos;
  char buffer [10];
  ostringstream ost;
  string *str_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(buffer + 2));
  uStack_1a8 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= uStack_1a8) break;
    pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)str);
    bVar1 = *pbVar3;
    if (((((bVar1 < 0x7f) && (0x1f < bVar1)) && (bVar1 != 0x26)) &&
        (((bVar1 != 0x25 && (bVar1 != 0x2b)) && ((bVar1 != 0x3d && (bVar1 != 0x40)))))) ||
       (bVar1 == 9)) {
      std::operator<<((ostream *)(buffer + 2),bVar1);
    }
    else {
      sprintf((char *)((long)&pos + 6),"%02x;",(ulong)bVar1);
      std::operator<<((ostream *)(buffer + 2),(char *)((long)&pos + 6));
    }
    uStack_1a8 = uStack_1a8 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(buffer + 2));
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::MakeURLSafe(const std::string& str)
{
  std::ostringstream ost;
  char buffer[10];
  for (std::string::size_type pos = 0; pos < str.size(); pos++) {
    unsigned char ch = str[pos];
    if ((ch > 126 || ch < 32 || ch == '&' || ch == '%' || ch == '+' ||
         ch == '=' || ch == '@') &&
        ch != 9) {
      sprintf(buffer, "%02x;", (unsigned int)ch);
      ost << buffer;
    } else {
      ost << ch;
    }
  }
  return ost.str();
}